

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

void duckdb::PragmaShowHelper::GetViewColumns
               (idx_t i,string *name,LogicalType *type,DataChunk *output,idx_t index)

{
  Value VStack_e8;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)name);
  Value::Value(&VStack_e8,&local_40);
  DataChunk::SetValue(output,0,index,&VStack_e8);
  Value::~Value(&VStack_e8);
  ::std::__cxx11::string::~string((string *)&local_40);
  LogicalType::ToString_abi_cxx11_(&local_60,type);
  Value::Value(&VStack_e8,(string *)&local_60);
  DataChunk::SetValue(output,1,index,&VStack_e8);
  Value::~Value(&VStack_e8);
  ::std::__cxx11::string::~string((string *)&local_60);
  Value::Value(&VStack_e8,"YES");
  DataChunk::SetValue(output,2,index,&VStack_e8);
  Value::~Value(&VStack_e8);
  LogicalType::LogicalType(&local_78,SQLNULL);
  Value::Value(&VStack_e8,&local_78);
  DataChunk::SetValue(output,3,index,&VStack_e8);
  Value::~Value(&VStack_e8);
  LogicalType::~LogicalType(&local_78);
  LogicalType::LogicalType(&local_90,SQLNULL);
  Value::Value(&VStack_e8,&local_90);
  DataChunk::SetValue(output,4,index,&VStack_e8);
  Value::~Value(&VStack_e8);
  LogicalType::~LogicalType(&local_90);
  LogicalType::LogicalType(&local_a8,SQLNULL);
  Value::Value(&VStack_e8,&local_a8);
  DataChunk::SetValue(output,5,index,&VStack_e8);
  Value::~Value(&VStack_e8);
  LogicalType::~LogicalType(&local_a8);
  return;
}

Assistant:

static void GetViewColumns(idx_t i, const string &name, const LogicalType &type, DataChunk &output, idx_t index) {
		// "column_name", PhysicalType::VARCHAR
		output.SetValue(0, index, Value(name));
		// "column_type", PhysicalType::VARCHAR
		output.SetValue(1, index, Value(type.ToString()));
		// "null", PhysicalType::VARCHAR
		output.SetValue(2, index, Value("YES"));
		// "key", PhysicalType::VARCHAR
		output.SetValue(3, index, Value());
		// "default", VARCHAR
		output.SetValue(4, index, Value());
		// "extra", VARCHAR
		output.SetValue(5, index, Value());
	}